

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

LPCWSTR __thiscall Js::RecyclableObjectDisplay::Value(RecyclableObjectDisplay *this,int radix)

{
  Var pvVar1;
  StringBuilder<Memory::ArenaAllocator> *this_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  JavascriptTypedNumber<long> *this_01;
  long lVar8;
  JavascriptTypedNumber<unsigned_long> *this_02;
  unsigned_long uVar9;
  JavascriptNumberObject *this_03;
  JavascriptString *pJVar10;
  undefined4 extraout_var;
  JavascriptLibrary *this_04;
  JavascriptString *pstRight;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ThreadContext *this_05;
  DebugManager *pDVar11;
  char16 *pcVar12;
  undefined1 auVar13 [16];
  StringBuilder<Memory::ArenaAllocator> *builder;
  RecyclableObject *obj;
  uint32 ul;
  bool isZero;
  int32 l;
  JavascriptNumberObject *numobj;
  double value;
  LPCWSTR valueStr;
  int radix_local;
  RecyclableObjectDisplay *this_local;
  TypeId local_74;
  TypeId local_64;
  TypeId local_54;
  TypeId local_48;
  TypeId typeId;
  TypeId typeId_1;
  TypeId typeId_2;
  TypeId typeId_3;
  
  value = 1.24591221628901e-316;
  bVar3 = TaggedInt::Is(this->instance);
  if (((!bVar3) && (bVar3 = JavascriptNumber::Is(this->instance), !bVar3)) &&
     (bVar3 = VarIs<Js::JavascriptNumberObject>(this->instance), !bVar3)) {
    pvVar1 = this->instance;
    if (pvVar1 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar3 = TaggedInt::Is(pvVar1);
    if (bVar3) {
      local_48 = TypeIds_FirstNumberType;
    }
    else {
      bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar1);
      if (bVar3) {
        local_48 = TypeIds_Number;
      }
      else {
        pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar1);
        if (pRVar7 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        local_48 = RecyclableObject::GetTypeId(pRVar7);
        if ((0x57 < (int)local_48) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    if (local_48 != TypeIds_Int64Number) {
      pvVar1 = this->instance;
      if (pvVar1 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar3 = TaggedInt::Is(pvVar1);
      if (bVar3) {
        local_54 = TypeIds_FirstNumberType;
      }
      else {
        bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar1);
        if (bVar3) {
          local_54 = TypeIds_Number;
        }
        else {
          pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar1);
          if (pRVar7 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          local_54 = RecyclableObject::GetTypeId(pRVar7);
          if ((0x57 < (int)local_54) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
        }
      }
      if (local_54 != TypeIds_LastNumberType) {
        pRVar7 = VarTo<Js::RecyclableObject>(this->instance);
        this_05 = ScriptContext::GetThreadContext(this->scriptContext);
        pDVar11 = ThreadContext::GetDebugManager(this_05);
        this_00 = pDVar11->pCurrentInterpreterLocation->stringBuilder;
        StringBuilder<Memory::ArenaAllocator>::Reset(this_00);
        iVar5 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x50])(pRVar7,this_00,this->scriptContext);
        if (iVar5 != 0) {
          pcVar12 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
          return pcVar12;
        }
        value = 1.26985196953198e-316;
        return (LPCWSTR)value;
      }
    }
  }
  bVar3 = TaggedInt::Is(this->instance);
  if (bVar3) {
    numobj = (JavascriptNumberObject *)TaggedInt::ToDouble(this->instance);
  }
  else {
    bVar3 = JavascriptNumber::Is(this->instance);
    if (bVar3) {
      numobj = (JavascriptNumberObject *)JavascriptNumber::GetValue(this->instance);
    }
    else {
      pvVar1 = this->instance;
      if (pvVar1 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar3 = TaggedInt::Is(pvVar1);
      if (bVar3) {
        local_64 = TypeIds_FirstNumberType;
      }
      else {
        bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar1);
        if (bVar3) {
          local_64 = TypeIds_Number;
        }
        else {
          pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar1);
          if (pRVar7 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          local_64 = RecyclableObject::GetTypeId(pRVar7);
          if ((0x57 < (int)local_64) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
        }
      }
      if (local_64 == TypeIds_Int64Number) {
        this_01 = VarTo<Js::JavascriptTypedNumber<long>>(this->instance);
        lVar8 = JavascriptTypedNumber<long>::GetValue(this_01);
        numobj = (JavascriptNumberObject *)(double)lVar8;
      }
      else {
        pvVar1 = this->instance;
        if (pvVar1 == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        bVar3 = TaggedInt::Is(pvVar1);
        if (bVar3) {
          local_74 = TypeIds_FirstNumberType;
        }
        else {
          bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar1);
          if (bVar3) {
            local_74 = TypeIds_Number;
          }
          else {
            pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar1);
            if (pRVar7 == (RecyclableObject *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            local_74 = RecyclableObject::GetTypeId(pRVar7);
            if ((0x57 < (int)local_74) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)
               ) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                          "GetTypeId aValue has invalid TypeId");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
          }
        }
        if (local_74 == TypeIds_LastNumberType) {
          this_02 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(this->instance);
          uVar9 = JavascriptTypedNumber<unsigned_long>::GetValue(this_02);
          auVar13._8_4_ = (int)(uVar9 >> 0x20);
          auVar13._0_8_ = uVar9;
          auVar13._12_4_ = 0x45300000;
          numobj = (JavascriptNumberObject *)
                   ((auVar13._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
        }
        else {
          this_03 = VarTo<Js::JavascriptNumberObject>(this->instance);
          numobj = (JavascriptNumberObject *)JavascriptNumberObject::GetValue(this_03);
        }
      }
    }
  }
  bVar3 = JavascriptNumber::IsZero((double)numobj - (double)(int)(double)numobj);
  if ((radix == 10) || (!bVar3)) {
    BVar4 = JavascriptNumber::IsNegZero((double)numobj);
    if (BVar4 == 0) {
      pJVar10 = JavascriptNumber::ToStringRadix10((double)numobj,this->scriptContext);
      iVar5 = (*(pJVar10->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
      value = (double)CONCAT44(extraout_var,iVar5);
    }
    else {
      value = (double)anon_var_dwarf_299b84f;
    }
  }
  else if ((1 < radix) && (radix < 0x25)) {
    if (radix == 0x10) {
      if ((double)numobj < 0.0) {
        numobj = (JavascriptNumberObject *)(double)(uint)(int)(double)numobj;
      }
      this_04 = ScriptContext::GetLibrary(this->scriptContext);
      pJVar10 = JavascriptLibrary::CreateStringFromCppLiteral<3ul>(this_04,(char16 (*) [3])L"0x");
      pstRight = JavascriptNumber::ToStringRadixHelper((double)numobj,0x10,this->scriptContext);
      pJVar10 = JavascriptString::Concat(pJVar10,pstRight);
      iVar5 = (*(pJVar10->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
      value = (double)CONCAT44(extraout_var_00,iVar5);
    }
    else {
      pJVar10 = JavascriptNumber::ToStringRadixHelper((double)numobj,radix,this->scriptContext);
      iVar5 = (*(pJVar10->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
      value = (double)CONCAT44(extraout_var_01,iVar5);
    }
  }
  return (LPCWSTR)value;
}

Assistant:

LPCWSTR RecyclableObjectDisplay::Value(int radix)
    {
        LPCWSTR valueStr = _u("");

        if(Js::TaggedInt::Is(instance)
            || Js::JavascriptNumber::Is(instance)
            || Js::VarIs<Js::JavascriptNumberObject>(instance)
            || Js::JavascriptOperators::GetTypeId(instance) == TypeIds_Int64Number
            || Js::JavascriptOperators::GetTypeId(instance) == TypeIds_UInt64Number)
        {
            double value;
            if (Js::TaggedInt::Is(instance))
            {
                value = TaggedInt::ToDouble(instance);
            }
            else if (Js::JavascriptNumber::Is(instance))
            {
                value = Js::JavascriptNumber::GetValue(instance);
            }
            else if (Js::JavascriptOperators::GetTypeId(instance) == TypeIds_Int64Number)
            {
                value = (double)VarTo<JavascriptInt64Number>(instance)->GetValue();
            }
            else if (Js::JavascriptOperators::GetTypeId(instance) == TypeIds_UInt64Number)
            {
                value = (double)VarTo<JavascriptUInt64Number>(instance)->GetValue();
            }
            else
            {
                Js::JavascriptNumberObject* numobj = Js::VarTo<Js::JavascriptNumberObject>(instance);
                value = numobj->GetValue();
            }

            // For fractional values, radix is ignored.
            int32 l = (int32)value;
            bool isZero = JavascriptNumber::IsZero(value - (double)l);

            if (radix == 10 || !isZero)
            {
                if (Js::JavascriptNumber::IsNegZero(value))
                {
                    // In debugger, we wanted to show negative zero explicitly
                    valueStr = _u("-0");
                }
                else
                {
                    valueStr = Js::JavascriptNumber::ToStringRadix10(value, scriptContext)->GetSz();
                }
            }
            else if (radix >= 2 && radix <= 36)
            {
                if (radix == 16)
                {
                    if (value < 0)
                    {
                        // On the tools side we show unsigned value.
                        uint32 ul = static_cast<uint32>(static_cast<int32>(value)); // ARM: casting negative value to uint32 gives 0
                        value = (double)ul;
                    }
                    valueStr = Js::JavascriptString::Concat(scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("0x")),
                                                            Js::JavascriptNumber::ToStringRadixHelper(value, radix, scriptContext))->GetSz();
                }
                else
                {
                    valueStr = Js::JavascriptNumber::ToStringRadixHelper(value, radix, scriptContext)->GetSz();
                }
            }
        }
        else
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(instance);

            StringBuilder<ArenaAllocator>* builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
            builder->Reset();

            if (obj->GetDiagValueString(builder, scriptContext))
            {
                valueStr = builder->Detach();
            }
            else
            {
                valueStr = _u("undefined");
            }
        }

        return valueStr;
    }